

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

int __thiscall QMetaObjectBuilder::indexOfSlot(QMetaObjectBuilder *this,QByteArray *signature)

{
  pointer pQVar1;
  pointer pQVar2;
  bool bVar3;
  qsizetype __n;
  int iVar4;
  pointer pQVar5;
  ulong uVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  int local_5c;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar7 = (signature->d).ptr;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  QMetaObject::normalizedSignature(&local_58,pcVar7);
  __n = local_58.d.size;
  pcVar7 = local_58.d.ptr;
  pQVar1 = (this->d->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar2 = (this->d->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = -1;
  if (pQVar1 != pQVar2) {
    uVar6 = 0;
    do {
      bVar3 = true;
      if ((((*(uint *)((long)&pQVar1->attributes + uVar6) & 0xc) == 8) &&
          ((undefined1 *)__n == *(undefined1 **)((long)&(pQVar1->signature).d.size + uVar6))) &&
         (((undefined1 *)__n == (undefined1 *)0x0 ||
          (iVar4 = bcmp(pcVar7,*(void **)((long)&(pQVar1->signature).d.ptr + uVar6),__n), iVar4 == 0
          )))) {
        local_5c = (int)(uVar6 >> 3) * -0x3b13b13b;
        bVar3 = false;
      }
      iVar4 = local_5c;
      if (!bVar3) goto LAB_0028d9c0;
      pQVar5 = (pointer)((long)&pQVar1[1].signature.d.d + uVar6);
      uVar6 = uVar6 + 0x68;
    } while (pQVar5 != pQVar2);
    iVar4 = -1;
  }
LAB_0028d9c0:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QMetaObjectBuilder::indexOfSlot(const QByteArray &signature)
{
    QByteArray sig = QMetaObject::normalizedSignature(signature);
    for (const auto &method : d->methods) {
        if (method.methodType() == QMetaMethod::Slot && sig == method.signature)
            return int(&method - &d->methods.front());
    }
    return -1;
}